

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

mat3 * dja::mat3::rotation(mat3 *__return_storage_ptr__,vec3 *axis,float_t rad)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  quaternion local_20;
  
  fVar3 = cosf(rad * 0.5);
  local_20.im.z = sinf(rad * 0.5);
  uVar1 = axis->x;
  uVar2 = axis->y;
  local_20.im.x = local_20.im.z * (float)uVar1;
  local_20.im.y = local_20.im.z * (float)uVar2;
  local_20.im.z = local_20.im.z * axis->z;
  local_20.re = fVar3;
  rotation(&local_20);
  return __return_storage_ptr__;
}

Assistant:

mat3 mat3::rotation(const vec3& axis, float_t rad)
{
    return rotation(quaternion::rotation(axis, rad));
}